

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_compilation.cpp
# Opt level: O1

void pstore::exchange::export_ns::emit_compilation_index
               (ostream_base *os,indent ind,database *db,uint generation,string_mapping *strings,
               bool comments)

{
  bool bVar1;
  uint uVar2;
  typed_address<pstore::trailer> tVar3;
  shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  compilations;
  anon_class_56_7_4f9db7a2 out_fn;
  char *sep;
  undefined1 local_95;
  uint local_94;
  hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  database *local_80;
  hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *local_78;
  long local_70;
  index *local_68;
  database *local_60;
  ostream_base *local_58;
  char **local_50;
  uint *local_48;
  string_mapping *local_40;
  undefined1 *local_38;
  char *local_30;
  
  local_95 = comments;
  local_94 = ind.distance_;
  index::
  get_index<(pstore::trailer::indices)0,pstore::database_const,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>const>
            ((index *)&local_90,db,true);
  if (local_90 !=
      (hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
       *)0x0) {
    bVar1 = index::
            hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
            ::empty(local_90);
    if (generation != 0 && !bVar1) {
      local_50 = &local_30;
      local_30 = "\n";
      local_48 = &local_94;
      local_38 = &local_95;
      local_68 = (index *)&local_90;
      local_60 = db;
      local_58 = os;
      local_40 = strings;
      uVar2 = database::get_current_revision(db);
      if (generation - 1 <= uVar2) {
        tVar3 = database::older_revision_footer_pos(db,generation - 1);
        local_70 = (long)tVar3.a_.a_ + 0x70;
        local_78 = local_90;
        local_80 = db;
        if ((local_90->root_).internal_ != (internal_node *)0x0) {
          diff_details::
          traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
          ::
          visit_node<pstore::exchange::export_ns::diff_out<pstore::exchange::export_ns::emit_compilation_index(pstore::exchange::export_ns::ostream_base&,pstore::exchange::export_ns::indent,pstore::database_const&,unsigned_int,pstore::exchange::export_ns::string_mapping_const&,bool)::__0>>
                    ((traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                      *)&local_80,local_90->root_,0,(anon_class_56_7_4f9db7a2 *)&local_68);
        }
      }
    }
  }
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  return;
}

Assistant:

void emit_compilation_index (ostream_base & os, indent const ind, database const & db,
                                         unsigned const generation, string_mapping const & strings,
                                         bool const comments) {
                auto const compilations = index::get_index<trailer::indices::compilation> (db);
                if (!compilations || compilations->empty ()) {
                    return;
                }
                if (generation == 0) {
                    // The first (zeroth) transaction in the store is, by definition, empty.
                    return;
                }
                auto const * sep = "\n";

                auto const out_fn = [&] (address const addr) {
                    auto const & kvp = compilations->load_leaf_node (db, addr);
                    os << sep << ind;
                    emit_digest (os, kvp.first);
                    os << ':';
                    emit_compilation (os, ind, db, *db.getro (kvp.second), strings, comments);
                    sep = ",\n";
                };
                diff (db, *compilations, generation - 1U, make_diff_out (&out_fn));
            }